

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O3

BOOL __thiscall Js::DiagStackFrame::IsThisAvailable(DiagStackFrame *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  uint uVar5;
  undefined4 extraout_var;
  ParseableFunctionInfo *pPVar6;
  undefined4 *puVar7;
  FunctionInfo *pFVar8;
  
  iVar3 = (*this->_vptr_DiagStackFrame[2])();
  BVar4 = JavascriptFunction::IsLambda((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
  if (BVar4 == 0) {
    uVar5 = 1;
  }
  else {
    pPVar6 = JavascriptFunction::GetParseableFunctionInfo
                       ((JavascriptFunction *)CONCAT44(extraout_var,iVar3));
    pFVar8 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
    if (pFVar8 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x514,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_008c405d;
      *puVar7 = 0;
      pFVar8 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
    }
    if ((ParseableFunctionInfo *)(pFVar8->functionBodyImpl).ptr != pPVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x515,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) {
LAB_008c405d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      pFVar8 = (pPVar6->super_FunctionProxy).functionInfo.ptr;
    }
    uVar5 = pFVar8->attributes >> 0xd & 1;
  }
  return uVar5;
}

Assistant:

BOOL DiagStackFrame::IsThisAvailable()
    {
        Js::JavascriptFunction* scopeFunction = this->GetJavascriptFunction();
        return !scopeFunction->IsLambda() || scopeFunction->GetParseableFunctionInfo()->GetCapturesThis();
    }